

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::charOrIntOrRange(GrpParser *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  RefToken *in_RDI;
  ParserException *ex;
  RefAST tmp143_AST;
  RefAST tmp142_AST;
  RefAST tmp141_AST;
  RefAST tmp140_AST;
  RefAST tmp139_AST;
  RefAST charOrIntOrRange_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe70;
  RefCount<AST> *in_stack_fffffffffffffe78;
  ASTPair *in_stack_fffffffffffffe80;
  RefCount<AST> *this_00;
  RefCount<AST> *in_stack_fffffffffffffe88;
  RefCount<AST> *in_stack_fffffffffffffe90;
  RefToken *in_stack_fffffffffffffea0;
  RefAST *root;
  ASTFactory *in_stack_fffffffffffffea8;
  ASTFactory *this_01;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  ASTPair *in_stack_fffffffffffffeb8;
  ASTFactory *in_stack_fffffffffffffec0;
  RefAST *this_02;
  undefined1 local_f8 [15];
  undefined1 local_e9;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [31];
  undefined1 local_79;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  this_02 = &nullAST;
  RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ASTPair::ASTPair(in_stack_fffffffffffffe80);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
  iVar1 = (*(code *)in_RDI->ref[2].ptr)(in_RDI,1);
  if (iVar1 == 0x11) {
    RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
    (**(code **)&in_RDI->ref[2].count)(local_68,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    iVar1 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffec0 = (ASTFactory *)(in_RDI + 6);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (RefAST *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar1);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  }
  else {
    if (iVar1 != 0x21) {
      local_79 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)&in_RDI->ref[2].count)(local_78,in_RDI,1);
      NoViableAltException::NoViableAltException((NoViableAltException *)this_02,in_RDI);
      local_79 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
    (**(code **)&in_RDI->ref[2].count)(local_48,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    iVar1 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
    ASTFactory::addASTChild
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (RefAST *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
    Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar1);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  }
  iVar1 = (*(code *)in_RDI->ref[2].ptr)(in_RDI,1);
  if (((iVar1 != 7) && (iVar1 != 0x11)) && (1 < iVar1 - 0x14U)) {
    if (iVar1 == 0x20) {
      RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
      this_01 = (ASTFactory *)(in_RDI + 6);
      (**(code **)&in_RDI->ref[2].count)(local_98,in_RDI,1);
      ASTFactory::create(this_01,in_stack_fffffffffffffea0);
      RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
      root = (RefAST *)(in_RDI + 6);
      RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
      ASTFactory::makeASTRoot
                ((ASTFactory *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),(ASTPair *)this_01,root);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
      Parser::match((Parser *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),
                    (int)((ulong)this_01 >> 0x20));
      iVar2 = (*(code *)in_RDI->ref[2].ptr)(in_RDI,1);
      if (iVar2 == 0x11) {
        RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
        this_00 = (RefCount<AST> *)(in_RDI + 6);
        (**(code **)&in_RDI->ref[2].count)(local_d8,in_RDI,1);
        ASTFactory::create(this_01,(RefToken *)root);
        iVar2 = (int)((ulong)this_01 >> 0x20);
        RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        RefCount<Token>::~RefCount((RefCount<Token> *)this_00);
        RefCount<AST>::RefCount(this_00,(RefCount<AST> *)(in_RDI + 6));
        ASTFactory::addASTChild
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (RefAST *)CONCAT44(iVar1,in_stack_fffffffffffffeb0));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        Parser::match((Parser *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),iVar2);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
      }
      else {
        if (iVar2 != 0x21) {
          local_e9 = 1;
          uVar3 = __cxa_allocate_exception(0x40);
          (**(code **)&in_RDI->ref[2].count)(local_e8,in_RDI,1);
          NoViableAltException::NoViableAltException((NoViableAltException *)this_02,in_RDI);
          local_e9 = 0;
          __cxa_throw(uVar3,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe90 = (RefCount<AST> *)(in_RDI + 6);
        (**(code **)&in_RDI->ref[2].count)(local_b8,in_RDI,1);
        ASTFactory::create(this_01,(RefToken *)root);
        iVar2 = (int)((ulong)this_01 >> 0x20);
        RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
        in_stack_fffffffffffffe88 = (RefCount<AST> *)(in_RDI + 6);
        RefCount<AST>::RefCount(&in_stack_fffffffffffffe80->root,in_stack_fffffffffffffe78);
        ASTFactory::addASTChild
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (RefAST *)CONCAT44(iVar1,in_stack_fffffffffffffeb0));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        Parser::match((Parser *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),iVar2);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
      }
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
    }
    else if (iVar1 != 0x21) {
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)&in_RDI->ref[2].count)(local_f8,in_RDI,1);
      NoViableAltException::NoViableAltException((NoViableAltException *)this_02,in_RDI);
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  RefCount<AST>::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffe70);
  return;
}

Assistant:

void GrpParser::charOrIntOrRange() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST charOrIntOrRange_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_CHAR:
		{
			RefAST tmp139_AST = nullAST;
			tmp139_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp139_AST);
			match(LIT_CHAR);
			break;
		}
		case LIT_INT:
		{
			RefAST tmp140_AST = nullAST;
			tmp140_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp140_AST);
			match(LIT_INT);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_DOTDOT:
		{
			RefAST tmp141_AST = nullAST;
			tmp141_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp141_AST);
			match(OP_DOTDOT);
			{
			switch ( LA(1)) {
			case LIT_CHAR:
			{
				RefAST tmp142_AST = nullAST;
				tmp142_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp142_AST);
				match(LIT_CHAR);
				break;
			}
			case LIT_INT:
			{
				RefAST tmp143_AST = nullAST;
				tmp143_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp143_AST);
				match(LIT_INT);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			break;
		}
		case OP_RPAREN:
		case LIT_INT:
		case LIT_STRING:
		case OP_COMMA:
		case LIT_CHAR:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		charOrIntOrRange_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_38);
	}
	returnAST = charOrIntOrRange_AST;
}